

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkUpdateReverseLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  Abc_Obj_t *pObj;
  int Level;
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pObj_00;
  long lVar5;
  
  Level = Abc_ObjReverseLevel(pObjNew);
  iVar1 = Abc_ObjReverseLevelNew(pObjNew);
  if (Level != iVar1) {
    Vec_VecClear(vLevels);
    Vec_VecPush(vLevels,Level,pObjNew);
    pObjNew->field_0x14 = pObjNew->field_0x14 | 0x10;
    for (; Level < vLevels->nSize; Level = Level + 1) {
      iVar1 = 0;
      while( true ) {
        pVVar4 = Vec_VecEntry(vLevels,Level);
        if (pVVar4->nSize <= iVar1) break;
        pVVar4 = Vec_VecEntry(vLevels,Level);
        pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,iVar1);
        pObj_00->field_0x14 = pObj_00->field_0x14 & 0xef;
        iVar2 = Abc_ObjReverseLevel(pObj_00);
        if (iVar2 != Level) {
          __assert_fail("LevelOld == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                        ,0x547,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
        }
        iVar2 = Abc_ObjReverseLevelNew(pObj_00);
        Abc_ObjSetReverseLevel(pObj_00,iVar2);
        iVar2 = Abc_ObjReverseLevel(pObj_00);
        if (iVar2 != Level) {
          for (lVar5 = 0; lVar5 < (pObj_00->vFanins).nSize; lVar5 = lVar5 + 1) {
            pObj = (Abc_Obj_t *)pObj_00->pNtk->vObjs->pArray[(pObj_00->vFanins).pArray[lVar5]];
            if ((((*(uint *)&pObj->field_0x14 & 0x10) == 0) &&
                (uVar3 = *(uint *)&pObj->field_0x14 & 0xf, uVar3 != 2)) && (uVar3 != 5)) {
              iVar2 = Abc_ObjReverseLevel(pObj);
              if (iVar2 < Level) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                              ,0x552,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
              }
              Vec_VecPush(vLevels,iVar2,pObj);
              pObj->field_0x14 = pObj->field_0x14 | 0x10;
            }
          }
        }
        iVar1 = iVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateReverseLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k, m;
    // check if level has changed
    LevelOld = Abc_ObjReverseLevel(pObjNew);
    if ( LevelOld == Abc_ObjReverseLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Abc_ObjReverseLevel(pTemp); 
        assert( LevelOld == Lev );
        Abc_ObjSetReverseLevel( pTemp, Abc_ObjReverseLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjReverseLevel(pTemp) == Lev )
            continue;
        // schedule fanins for level update
        Abc_ObjForEachFanin( pTemp, pFanin, m )
        {
            if ( !Abc_ObjIsCi(pFanin) && !pFanin->fMarkA )
            {
                LevFanin = Abc_ObjReverseLevel( pFanin );
                assert( LevFanin >= Lev );
                Vec_VecPush( vLevels, LevFanin, pFanin );
                pFanin->fMarkA = 1;
            }
        }
    }
}